

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaTransformer.cpp
# Opt level: O1

Formula * __thiscall Kernel::FormulaTransformer::applyBinary(FormulaTransformer *this,Formula *f)

{
  Formula *pFVar1;
  Formula *pFVar2;
  Formula *pFVar3;
  void **head;
  
  pFVar1 = apply(this,*(Formula **)(f + 1));
  pFVar2 = apply(this,(Formula *)f[1]._label._M_dataplus._M_p);
  if ((pFVar1 != *(Formula **)(f + 1)) || (pFVar2 != (Formula *)f[1]._label._M_dataplus._M_p)) {
    pFVar3 = (Formula *)
             ::Lib::FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    pFVar3->_connective = f->_connective;
    (pFVar3->_label)._M_dataplus._M_p = (pointer)&(pFVar3->_label).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pFVar3->_label,Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b7c330 + Formula::DEFAULT_LABEL_abi_cxx11_);
    *(Formula **)(pFVar3 + 1) = pFVar1;
    pFVar3[1]._label._M_dataplus._M_p = (pointer)pFVar2;
    f = pFVar3;
  }
  return f;
}

Assistant:

Formula* FormulaTransformer::applyBinary(Formula* f)
{
  Formula* newLeft = apply(f->left());
  Formula* newRight = apply(f->right());
  if(newLeft==f->left() && newRight==f->right()) {
    return f;
  }
  return new BinaryFormula(f->connective(), newLeft, newRight);
}